

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O1

void __thiscall RecoveryTest_SigtermTest_Test::TestBody(RecoveryTest_SigtermTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *message;
  DeathTest *gtest_dt;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  char regex [19];
  DeathTest *local_108;
  DeathTest *local_100;
  ExitedOrKilled local_f8 [4];
  char local_d8 [32];
  RE local_b8;
  
  builtin_strncpy(local_d8,"posixSignalHandler",0x13);
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_0010d450;
  testing::internal::RE::Init(&local_b8,local_d8);
  bVar3 = testing::internal::DeathTest::Create
                    ("RaiseSigterm()",&local_b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
                     ,0x60,&local_108);
  bVar2 = true;
  if (bVar3) {
    if (local_108 != (DeathTest *)0x0) {
      local_100 = local_108;
      iVar5 = (*local_108->_vptr_DeathTest[2])();
      pDVar1 = local_108;
      if (iVar5 == 0) {
        extensions::ExitedOrKilled::ExitedOrKilled(local_f8,3,0xf);
        iVar5 = (*local_108->_vptr_DeathTest[3])();
        bVar2 = extensions::ExitedOrKilled::operator()(local_f8,iVar5);
        iVar5 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar5 != '\0') goto LAB_0010d406;
        bVar2 = true;
        bVar3 = false;
      }
      else {
        if (iVar5 == 1) {
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            RaiseSigterm();
          }
          (*local_108->_vptr_DeathTest[5])(local_108,2);
          (*pDVar1->_vptr_DeathTest[5])(pDVar1,0);
        }
LAB_0010d406:
        bVar2 = false;
        bVar3 = true;
      }
      if (local_100 != (DeathTest *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (local_100 != (DeathTest *)0x0)) {
          (*local_100->_vptr_DeathTest[1])();
        }
        local_100 = (DeathTest *)0x0;
      }
      if (!bVar3) goto LAB_0010d441;
    }
    bVar2 = false;
  }
LAB_0010d441:
  testing::internal::RE::~RE(&local_b8);
  if (!bVar2) {
    return;
  }
LAB_0010d450:
  testing::Message::Message((Message *)&local_b8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_f8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
             ,0x60,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
  if ((((long *)local_b8.pattern_ != (long *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)local_b8.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_b8.pattern_ + 8))();
  }
  return;
}

Assistant:

TEST_F (RecoveryTest, SigtermTest) {
#ifdef _WIN32
    const char regex[] = "::SigtermHandler";
#else
    const char regex[] = "posixSignalHandler";
#endif

    ASSERT_EXIT(RaiseSigterm(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGTERM), regex);
}